

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O3

JavascriptString * Js::TaggedInt::ToString(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString *pJVar4;
  char *message;
  char *error;
  uint lineNumber;
  
  if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00b0cadf;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    error = "(Is(aValue))";
    message = "Ensure var is actually a \'TaggedInt\'";
    lineNumber = 0x43;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,lineNumber,error,message);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00b0cadf:
  pJVar4 = ToString((int)aValue,scriptContext);
  return pJVar4;
}

Assistant:

JavascriptString* TaggedInt::ToString(Var aValue,ScriptContext* scriptContext)
    {
        return ToString(ToInt32(aValue), scriptContext);
    }